

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ITrackerPtr __thiscall
Catch::TestCaseTracking::TrackerBase::findChild(TrackerBase *this,NameAndLocation *nameAndLocation)

{
  shared_ptr<Catch::TestCaseTracking::ITracker> *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  ulong uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  long lVar6;
  __normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  __it;
  __normal_iterator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_*,_std::vector<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>_>
  _Var7;
  shared_ptr<Catch::TestCaseTracking::ITracker> *psVar8;
  ITrackerPtr IVar9;
  
  __it._M_current =
       *(shared_ptr<Catch::TestCaseTracking::ITracker> **)
        ((long)&nameAndLocation[1].name.field_2 + 8);
  psVar1 = (shared_ptr<Catch::TestCaseTracking::ITracker> *)nameAndLocation[1].location.file;
  uVar4 = (long)psVar1 - (long)__it._M_current;
  _Var5._M_pi = in_RDX;
  if (0 < (long)uVar4 >> 6) {
    psVar8 = (shared_ptr<Catch::TestCaseTracking::ITracker> *)
             ((long)&((__it._M_current)->
                     super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr + (uVar4 & 0xffffffffffffffc0));
    lVar6 = ((long)uVar4 >> 6) + 1;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::$_0>
              ::operator()((_Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::__0>
                            *)in_RDX,__it);
      _Var5._M_pi = extraout_RDX;
      _Var7._M_current = __it._M_current;
      if (bVar3) goto LAB_0012faeb;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::$_0>
              ::operator()((_Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::__0>
                            *)in_RDX,__it._M_current + 1);
      _Var5._M_pi = extraout_RDX_00;
      _Var7._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_0012faeb;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::$_0>
              ::operator()((_Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::__0>
                            *)in_RDX,__it._M_current + 2);
      _Var5._M_pi = extraout_RDX_01;
      _Var7._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_0012faeb;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::$_0>
              ::operator()((_Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::__0>
                            *)in_RDX,__it._M_current + 3);
      _Var5._M_pi = extraout_RDX_02;
      _Var7._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_0012faeb;
      __it._M_current = __it._M_current + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
    uVar4 = (long)psVar1 - (long)psVar8;
    _Var5._M_pi = extraout_RDX_02;
    __it._M_current = psVar8;
  }
  lVar6 = (long)uVar4 >> 4;
  if (lVar6 == 1) {
LAB_0012fad4:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::$_0>
            ::operator()((_Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::__0>
                          *)in_RDX,__it);
    _Var5._M_pi = extraout_RDX_05;
    _Var7._M_current = __it._M_current;
    if (!bVar3) {
      _Var7._M_current = psVar1;
    }
LAB_0012faeb:
    if (_Var7._M_current != psVar1) {
      (this->super_ITracker)._vptr_ITracker =
           (_func_int **)
           ((_Var7._M_current)->
           super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      p_Var2 = ((_Var7._M_current)->
               super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      (this->super_ITracker).m_nameAndLocation.name._M_dataplus._M_p = (pointer)p_Var2;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      goto LAB_0012fb21;
    }
  }
  else {
    if (lVar6 == 2) {
LAB_0012fabc:
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::$_0>
              ::operator()((_Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::__0>
                            *)in_RDX,__it);
      _Var5._M_pi = extraout_RDX_04;
      _Var7._M_current = __it._M_current;
      if (!bVar3) {
        __it._M_current = __it._M_current + 1;
        goto LAB_0012fad4;
      }
      goto LAB_0012faeb;
    }
    if (lVar6 == 3) {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::$_0>
              ::operator()((_Iter_pred<Catch::TestCaseTracking::TrackerBase::findChild(Catch::TestCaseTracking::NameAndLocation_const&)::__0>
                            *)in_RDX,__it);
      _Var5._M_pi = extraout_RDX_03;
      _Var7._M_current = __it._M_current;
      if (!bVar3) {
        __it._M_current = __it._M_current + 1;
        goto LAB_0012fabc;
      }
      goto LAB_0012faeb;
    }
  }
  (this->super_ITracker)._vptr_ITracker = (_func_int **)0x0;
  (this->super_ITracker).m_nameAndLocation.name._M_dataplus._M_p = (pointer)0x0;
LAB_0012fb21:
  IVar9.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  IVar9.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ITracker;
  return (ITrackerPtr)
         IVar9.super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ITrackerPtr TrackerBase::findChild( NameAndLocation const& nameAndLocation ) {
        auto it = std::find_if( m_children.begin(), m_children.end(),
            [&nameAndLocation]( ITrackerPtr const& tracker ){
                return
                    tracker->nameAndLocation().location == nameAndLocation.location &&
                    tracker->nameAndLocation().name == nameAndLocation.name;
            } );
        return( it != m_children.end() )
            ? *it
            : nullptr;
    }